

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

uhugeint_t
duckdb::TryCastCInternal<duckdb::hugeint_t,duckdb::uhugeint_t,duckdb::TryCast>
          (duckdb_result *result,idx_t col,idx_t row)

{
  void *pvVar1;
  bool bVar2;
  bool in_R8B;
  uhugeint_t uVar3;
  hugeint_t input;
  uhugeint_t result_value;
  uint64_t local_40;
  uint64_t local_38;
  uhugeint_t local_30 [2];
  
  pvVar1 = result->deprecated_columns[col].deprecated_data;
  input.upper = (int64_t)&local_40;
  input.lower = *(uint64_t *)((long)pvVar1 + row * 0x10 + 8);
  bVar2 = TryCast::Operation<duckdb::hugeint_t,duckdb::uhugeint_t>
                    (*(TryCast **)((long)pvVar1 + row * 0x10),input,(uhugeint_t *)0x0,in_R8B);
  if (!bVar2) {
    uhugeint_t::uhugeint_t(local_30,0);
    local_40 = local_30[0].lower;
    local_38 = local_30[0].upper;
  }
  uVar3.upper = local_38;
  uVar3.lower = local_40;
  return uVar3;
}

Assistant:

void *UnsafeFetchPtr(duckdb_result *result, idx_t col, idx_t row) {
	D_ASSERT(row < result->deprecated_row_count);
	return (void *)&(((T *)result->deprecated_columns[col].deprecated_data)[row]);
}